

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O3

Vec_Int_t * Acec_FindXorRoots(Gia_Man_t *p,Vec_Int_t *vXors)

{
  uint uVar1;
  bool bVar2;
  Vec_Bit_t *__ptr;
  Vec_Int_t *pVVar3;
  int *__ptr_00;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  
  __ptr = Acec_MapXorIns(p,vXors);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  __ptr_00 = (int *)malloc(400);
  pVVar3->pArray = __ptr_00;
  iVar4 = vXors->nSize;
  if (0 < iVar4) {
    iVar8 = 0;
    uVar5 = 0;
    do {
      uVar5 = vXors->pArray[uVar5];
      if (((int)uVar5 < 0) || (__ptr->nSize <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if (((uint)__ptr->pArray[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) == 0) {
        uVar1 = pVVar3->nSize;
        uVar7 = (ulong)uVar1;
        if (0 < (int)uVar1) {
          uVar6 = 0;
          do {
            if (__ptr_00[uVar6] == uVar5) goto LAB_00687ae6;
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
        if (uVar1 == pVVar3->nCap) {
          if ((int)uVar1 < 0x10) {
            if (__ptr_00 == (int *)0x0) {
              __ptr_00 = (int *)malloc(0x40);
            }
            else {
              __ptr_00 = (int *)realloc(__ptr_00,0x40);
            }
            pVVar3->pArray = __ptr_00;
            iVar4 = 0x10;
            if (__ptr_00 == (int *)0x0) {
LAB_00687b40:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          else {
            if (__ptr_00 == (int *)0x0) {
              __ptr_00 = (int *)malloc(uVar7 * 8);
            }
            else {
              __ptr_00 = (int *)realloc(__ptr_00,uVar7 * 8);
            }
            pVVar3->pArray = __ptr_00;
            if (__ptr_00 == (int *)0x0) goto LAB_00687b40;
            iVar4 = uVar1 * 2;
          }
          pVVar3->nCap = iVar4;
        }
        pVVar3->nSize = uVar1 + 1;
        if (0 < (int)uVar1) {
          do {
            if (__ptr_00[uVar7 - 1] <= (int)uVar5) goto LAB_00687adb;
            __ptr_00[uVar7] = __ptr_00[uVar7 - 1];
            bVar2 = 1 < uVar7;
            uVar7 = uVar7 - 1;
          } while (bVar2);
          uVar7 = 0;
        }
LAB_00687adb:
        __ptr_00[(int)uVar7] = uVar5;
        iVar4 = vXors->nSize;
      }
LAB_00687ae6:
      iVar8 = iVar8 + 1;
      uVar5 = iVar8 * 4;
    } while ((int)uVar5 < iVar4);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return pVVar3;
}

Assistant:

Vec_Int_t * Acec_FindXorRoots( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMapXorIns = Acec_MapXorIns( p, vXors );
    Vec_Int_t * vXorRoots = Vec_IntAlloc( 100 );  int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        if ( !Vec_BitEntry(vMapXorIns, Vec_IntEntry(vXors, 4*i)) )
            Vec_IntPushUniqueOrder( vXorRoots, Vec_IntEntry(vXors, 4*i) );
    Vec_BitFree( vMapXorIns );
    return vXorRoots;
}